

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdCreateSimpleHandle_Test::TestBody(cfdcapi_common_CfdCreateSimpleHandle_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  void *handle;
  AssertionResult gtest_ar;
  int ret;
  bool *in_stack_fffffffffffffeb8;
  AssertionResult *in_stack_fffffffffffffec0;
  CfdErrorCode *in_stack_fffffffffffffec8;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  void **in_stack_fffffffffffffed8;
  AssertionResult *this_01;
  AssertHelper local_e8;
  Message local_e0;
  undefined4 local_d4;
  AssertionResult local_d0;
  string local_c0;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_89;
  AssertionResult local_88;
  AssertHelper local_78;
  Message local_70;
  undefined4 local_64;
  AssertionResult local_60;
  long local_50;
  AssertHelper local_48;
  Message local_40 [3];
  undefined4 local_24;
  AssertionResult local_20;
  int local_c;
  
  local_c = CfdCreateSimpleHandle(in_stack_fffffffffffffed8);
  local_24 = 1;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffed8,
             (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32813e);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message((Message *)0x32819b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3281f3);
  local_50 = 0;
  local_c = CfdCreateSimpleHandle(in_stack_fffffffffffffed8);
  local_64 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffed8,
             (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3282b4);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x328311);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x328366);
  local_89 = local_50 != 0;
  this_01 = &local_88;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(type *)0x328397);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)&local_88,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    testing::Message::~Message((Message *)0x32848a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x328502);
  local_c = CfdFreeHandle(in_stack_fffffffffffffec8);
  local_d4 = 0;
  this_00 = &local_d0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&this_01->success_,
             (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             (CfdErrorCode *)this_00,(int *)in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3285a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message((Message *)0x3285f6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x328642);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdCreateSimpleHandle) {
  int ret = CfdCreateSimpleHandle(NULL);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  void* handle = NULL;
  ret = CfdCreateSimpleHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}